

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  uint uVar1;
  ImDrawList *pIVar2;
  ImVec2 p_max;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiID id_00;
  ImGuiWindow *pIVar5;
  ImGuiCol IVar6;
  ImDrawCornerFlags IVar7;
  float fVar8;
  ImVec2 IVar9;
  byte local_1b9;
  float local_19c;
  float local_178;
  float local_174;
  bool ret;
  ImGuiWindowFlags local_164;
  ImGuiWindowFlags window_flags;
  ImVec2 local_158;
  ImVec2 local_150;
  ImVec2 pos;
  ImRect r_outer;
  ImVec2 size_expected;
  ImGuiWindow *popup_window;
  char name [16];
  ImVec2 local_10c;
  int local_104;
  ImVec2 IStack_100;
  int popup_max_height_in_items;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_e8 [3];
  ImVec2 local_cc;
  ImVec2 local_c4;
  ImU32 local_bc;
  ImU32 local_b8;
  ImU32 text_col;
  ImU32 bg_col;
  float local_ac;
  ImU32 local_a8;
  float value_x2;
  ImU32 frame_col;
  bool popup_open;
  bool pressed;
  bool held;
  bool hovered;
  ImVec2 local_98;
  undefined1 local_90 [8];
  ImRect total_bb;
  ImVec2 local_78;
  undefined1 local_70 [8];
  ImRect frame_bb;
  float w;
  float expected_w;
  ImVec2 label_size;
  float arrow_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiWindow *window;
  bool has_window_size_constraint;
  ImGuiContext *g;
  ImGuiComboFlags flags_local;
  char *preview_value_local;
  char *label_local;
  
  pIVar3 = GImGui;
  uVar1 = (GImGui->NextWindowData).Flags;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags & 0xffffffef;
  pIVar5 = GetCurrentWindow();
  if ((pIVar5->SkipItems & 1U) == 0) {
    if ((flags & 0x60U) == 0x60) {
      __assert_fail("(flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                    ,0x5ed,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
    }
    id_00 = ImGuiWindow::GetID(pIVar5,label,(char *)0x0);
    if ((flags & 0x20U) == 0) {
      local_174 = GetFrameHeight();
    }
    else {
      local_174 = 0.0;
    }
    IVar9 = CalcTextSize(label,(char *)0x0,true,-1.0);
    frame_bb.Max.y = CalcItemWidth();
    local_178 = frame_bb.Max.y;
    if ((flags & 0x40U) != 0) {
      local_178 = local_174;
    }
    frame_bb.Max.x = local_178;
    expected_w = IVar9.y;
    fVar8 = (pIVar3->Style).FramePadding.y;
    ImVec2::ImVec2(&total_bb.Max,local_178,fVar8 + fVar8 + expected_w);
    local_78 = operator+(&(pIVar5->DC).CursorPos,&total_bb.Max);
    ImRect::ImRect((ImRect *)local_70,&(pIVar5->DC).CursorPos,&local_78);
    w = IVar9.x;
    if (w <= 0.0) {
      local_19c = 0.0;
    }
    else {
      local_19c = (pIVar3->Style).ItemInnerSpacing.x + w;
    }
    ImVec2::ImVec2((ImVec2 *)&frame_col,local_19c,0.0);
    local_98 = operator+(&frame_bb.Min,(ImVec2 *)&frame_col);
    ImRect::ImRect((ImRect *)local_90,(ImVec2 *)local_70,&local_98);
    ItemSize((ImRect *)local_90,(pIVar3->Style).FramePadding.y);
    bVar4 = ItemAdd((ImRect *)local_90,id_00,(ImRect *)local_70);
    if (bVar4) {
      value_x2._1_1_ =
           ButtonBehavior((ImRect *)local_70,id_00,(bool *)((long)&value_x2 + 3),
                          (bool *)((long)&value_x2 + 2),0);
      value_x2._0_1_ = IsPopupOpen(id_00,0);
      IVar6 = 7;
      if ((value_x2._3_1_ & 1) != 0) {
        IVar6 = 8;
      }
      local_a8 = GetColorU32(IVar6,1.0);
      local_ac = ImMax<float>((float)local_70._0_4_,frame_bb.Min.x - local_174);
      RenderNavHighlight((ImRect *)local_70,id_00,1);
      if ((flags & 0x40U) == 0) {
        pIVar2 = pIVar5->DrawList;
        ImVec2::ImVec2((ImVec2 *)&text_col,local_ac,frame_bb.Min.y);
        IVar7 = 5;
        if ((flags & 0x20U) != 0) {
          IVar7 = 0xf;
        }
        ImDrawList::AddRectFilled
                  (pIVar2,(ImVec2 *)local_70,(ImVec2 *)&text_col,local_a8,
                   (pIVar3->Style).FrameRounding,IVar7);
      }
      if ((flags & 0x20U) == 0) {
        local_1b9 = 1;
        if ((value_x2._0_1_ & 1) == 0) {
          local_1b9 = value_x2._3_1_;
        }
        IVar6 = 0x15;
        if ((local_1b9 & 1) != 0) {
          IVar6 = 0x16;
        }
        local_b8 = GetColorU32(IVar6,1.0);
        local_bc = GetColorU32(0,1.0);
        pIVar2 = pIVar5->DrawList;
        ImVec2::ImVec2(&local_c4,local_ac,(float)local_70._4_4_);
        IVar7 = 10;
        if (frame_bb.Max.x <= local_174) {
          IVar7 = 0xf;
        }
        ImDrawList::AddRectFilled
                  (pIVar2,&local_c4,&frame_bb.Min,local_b8,(pIVar3->Style).FrameRounding,IVar7);
        if ((local_ac + local_174) - (pIVar3->Style).FramePadding.x <= frame_bb.Min.x) {
          pIVar2 = pIVar5->DrawList;
          fVar8 = (pIVar3->Style).FramePadding.y;
          ImVec2::ImVec2(&local_cc,local_ac + fVar8,(float)local_70._4_4_ + fVar8);
          RenderArrow(pIVar2,local_cc,local_bc,3,1.0);
        }
      }
      IVar9.y = (float)local_70._4_4_;
      IVar9.x = (float)local_70._0_4_;
      p_max.y = frame_bb.Min.y;
      p_max.x = frame_bb.Min.x;
      RenderFrameBorder(IVar9,p_max,(pIVar3->Style).FrameRounding);
      if ((preview_value != (char *)0x0) && ((flags & 0x40U) == 0)) {
        local_e8[0] = operator+((ImVec2 *)local_70,&(pIVar3->Style).FramePadding);
        ImVec2::ImVec2(&local_f0,local_ac,frame_bb.Min.y);
        ImVec2::ImVec2(&local_f8,0.0,0.0);
        RenderTextClipped(local_e8,&local_f0,preview_value,(char *)0x0,(ImVec2 *)0x0,&local_f8,
                          (ImRect *)0x0);
      }
      if (0.0 < w) {
        ImVec2::ImVec2(&stack0xffffffffffffff00,frame_bb.Min.x + (pIVar3->Style).ItemInnerSpacing.x,
                       (float)local_70._4_4_ + (pIVar3->Style).FramePadding.y);
        RenderText(IStack_100,label,(char *)0x0,true);
      }
      if ((((value_x2._1_1_ & 1) != 0) || (pIVar3->NavActivateId == id_00)) &&
         ((value_x2._0_1_ & 1) == 0)) {
        if ((pIVar5->DC).NavLayerCurrent == ImGuiNavLayer_Main) {
          pIVar5->NavLastIds[0] = id_00;
        }
        OpenPopupEx(id_00,0);
        value_x2._0_1_ = 1;
      }
      if ((value_x2._0_1_ & 1) == 0) {
        label_local._7_1_ = false;
      }
      else {
        g._4_4_ = flags;
        if ((uVar1 & 0x10) == 0) {
          if ((flags & 0x1eU) == 0) {
            g._4_4_ = flags | 4;
          }
          bVar4 = ImIsPowerOfTwo(g._4_4_ & 0x1e);
          if (!bVar4) {
            __assert_fail("ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                          ,0x627,
                          "bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
          }
          local_104 = -1;
          if ((g._4_4_ & 4) == 0) {
            if ((g._4_4_ & 2) == 0) {
              if ((g._4_4_ & 8) != 0) {
                local_104 = 0x14;
              }
            }
            else {
              local_104 = 4;
            }
          }
          else {
            local_104 = 8;
          }
          ImVec2::ImVec2(&local_10c,frame_bb.Max.x,0.0);
          fVar8 = CalcMaxPopupHeightFromItemCount(local_104);
          ImVec2::ImVec2((ImVec2 *)(name + 0xc),3.4028235e+38,fVar8);
          SetNextWindowSizeConstraints
                    (&local_10c,(ImVec2 *)(name + 0xc),(ImGuiSizeCallback)0x0,(void *)0x0);
        }
        else {
          (pIVar3->NextWindowData).Flags = (pIVar3->NextWindowData).Flags | 0x10;
          fVar8 = ImMax<float>((pIVar3->NextWindowData).SizeConstraintRect.Min.x,frame_bb.Max.x);
          (pIVar3->NextWindowData).SizeConstraintRect.Min.x = fVar8;
        }
        ImFormatString((char *)&popup_window,0x10,"##Combo_%02d",
                       (ulong)(uint)(pIVar3->BeginPopupStack).Size);
        pIVar5 = FindWindowByName((char *)&popup_window);
        if ((pIVar5 != (ImGuiWindow *)0x0) && ((pIVar5->WasActive & 1U) != 0)) {
          r_outer.Max = CalcWindowExpectedSize(pIVar5);
          if ((g._4_4_ & 1) != 0) {
            pIVar5->AutoPosLastDirection = 0;
          }
          _pos = GetWindowAllowedExtentRect(pIVar5);
          local_158 = ImRect::GetBL((ImRect *)local_70);
          local_150 = FindBestWindowPosForPopupEx
                                (&local_158,&r_outer.Max,&pIVar5->AutoPosLastDirection,
                                 (ImRect *)&pos,(ImRect *)local_70,ImGuiPopupPositionPolicy_ComboBox
                                );
          ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffea0,0.0,0.0);
          SetNextWindowPos(&local_150,0,(ImVec2 *)&stack0xfffffffffffffea0);
        }
        local_164 = 0x4000147;
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffe94,(pIVar3->Style).FramePadding.x,
                       (pIVar3->Style).WindowPadding.y);
        PushStyleVar(1,(ImVec2 *)&stack0xfffffffffffffe94);
        bVar4 = Begin((char *)&popup_window,(bool *)0x0,local_164);
        PopStyleVar(1);
        if (!bVar4) {
          EndPopup();
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                        ,0x648,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)"
                       );
        }
        label_local._7_1_ = true;
      }
    }
    else {
      label_local._7_1_ = false;
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    // Always consume the SetNextWindowSizeConstraint() call in our early return paths
    ImGuiContext& g = *GImGui;
    bool has_window_size_constraint = (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint) != 0;
    g.NextWindowData.Flags &= ~ImGuiNextWindowDataFlags_HasSizeConstraint;

    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float expected_w = CalcItemWidth();
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : expected_w;
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y * 2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(frame_bb, id, &hovered, &held);
    bool popup_open = IsPopupOpen(id, ImGuiPopupFlags_None);

    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    const float value_x2 = ImMax(frame_bb.Min.x, frame_bb.Max.x - arrow_size);
    RenderNavHighlight(frame_bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(frame_bb.Min, ImVec2(value_x2, frame_bb.Max.y), frame_col, style.FrameRounding, (flags & ImGuiComboFlags_NoArrowButton) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Left);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        ImU32 bg_col = GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
        ImU32 text_col = GetColorU32(ImGuiCol_Text);
        window->DrawList->AddRectFilled(ImVec2(value_x2, frame_bb.Min.y), frame_bb.Max, bg_col, style.FrameRounding, (w <= arrow_size) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Right);
        if (value_x2 + arrow_size - style.FramePadding.x <= frame_bb.Max.x)
            RenderArrow(window->DrawList, ImVec2(value_x2 + style.FramePadding.y, frame_bb.Min.y + style.FramePadding.y), text_col, ImGuiDir_Down, 1.0f);
    }
    RenderFrameBorder(frame_bb.Min, frame_bb.Max, style.FrameRounding);
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
        RenderTextClipped(frame_bb.Min + style.FramePadding, ImVec2(value_x2, frame_bb.Max.y), preview_value, NULL, NULL, ImVec2(0.0f, 0.0f));
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    if ((pressed || g.NavActivateId == id) && !popup_open)
    {
        if (window->DC.NavLayerCurrent == 0)
            window->NavLastIds[0] = id;
        OpenPopupEx(id, ImGuiPopupFlags_None);
        popup_open = true;
    }

    if (!popup_open)
        return false;

    if (has_window_size_constraint)
    {
        g.NextWindowData.Flags |= ImGuiNextWindowDataFlags_HasSizeConstraint;
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_));    // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth

    // Peak into expected window size so we can position it
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            ImVec2 size_expected = CalcWindowExpectedSize(popup_window);
            if (flags & ImGuiComboFlags_PopupAlignLeft)
                popup_window->AutoPosLastDirection = ImGuiDir_Left;
            ImRect r_outer = GetWindowAllowedExtentRect(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(frame_bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, frame_bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // We don't use BeginPopupEx() solely because we have a custom name string, which we could make an argument to BeginPopupEx()
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoMove;

    // Horizontally align ourselves with the framed text
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(style.FramePadding.x, style.WindowPadding.y));
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}